

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# virtual_mips.h
# Opt level: O2

shared_ptr<vmips::CFGNode> __thiscall
vmips::Function::new_section_branch<vmips::beqz,std::shared_ptr<vmips::VirtReg>&>
          (Function *this,shared_ptr<vmips::VirtReg> *args)

{
  shared_ptr<vmips::VirtReg> *in_RDX;
  __shared_count<(__gnu_cxx::_Lock_policy)2> extraout_RDX;
  shared_ptr<vmips::CFGNode> sVar1;
  undefined1 local_50 [40];
  
  local_50._0_8_ = args;
  vmips::Function::next_name_abi_cxx11_();
  std::make_shared<vmips::CFGNode,vmips::Function*,std::__cxx11::string>
            ((Function **)this,
             (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_50);
  std::__cxx11::string::~string((string *)(local_50 + 8));
  CFGNode::branch_existing<vmips::beqz,std::shared_ptr<vmips::VirtReg>&>
            ((CFGNode *)
             args[0x14].super___shared_ptr<vmips::VirtReg,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
             _M_pi,(shared_ptr<vmips::CFGNode> *)this,in_RDX);
  std::vector<std::shared_ptr<vmips::CFGNode>,_std::allocator<std::shared_ptr<vmips::CFGNode>_>_>::
  push_back((vector<std::shared_ptr<vmips::CFGNode>,_std::allocator<std::shared_ptr<vmips::CFGNode>_>_>
             *)(args + 0x13),(value_type *)this);
  vmips::Function::switch_to((shared_ptr *)args);
  sVar1.super___shared_ptr<vmips::CFGNode,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi =
       extraout_RDX._M_pi;
  sVar1.super___shared_ptr<vmips::CFGNode,_(__gnu_cxx::_Lock_policy)2>._M_ptr = (element_type *)this
  ;
  return (shared_ptr<vmips::CFGNode>)
         sVar1.super___shared_ptr<vmips::CFGNode,_(__gnu_cxx::_Lock_policy)2>;
}

Assistant:

std::shared_ptr<CFGNode> new_section_branch(Args &&...args) {
            auto node = std::make_shared<CFGNode>(this, next_name());
            cursor->branch_existing<Instr>(node, std::forward<Args>(args)...);
            this->blocks.push_back(node);
            switch_to(node);
            return node;
        }